

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_close(intptr_t uuid)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  
  if (-1 < uuid) {
    uVar1 = (uint)((ulong)uuid >> 8);
    if (uVar1 < fio_data->capa) {
      lVar3 = (long)(int)uVar1 * 0xa8;
      if (*(char *)((long)fio_data + lVar3 + 0x6d) == (char)uuid) {
        if ((*(long *)((long)fio_data + lVar3 + 0x40) == 0) &&
           (*(char *)((long)fio_data + lVar3 + 0x6e) == '\0')) {
          fio_force_close(uuid);
          return;
        }
        *(undefined1 *)((long)fio_data + lVar3 + 0x70) = 1;
        fio_poll_add_write((long)(int)uVar1);
        return;
      }
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 9;
  return;
}

Assistant:

void fio_close(intptr_t uuid) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return;
  }
  if (uuid_data(uuid).packet || uuid_data(uuid).sock_lock) {
    uuid_data(uuid).close = 1;
    fio_poll_add_write(fio_uuid2fd(uuid));
    return;
  }
  fio_force_close(uuid);
}